

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

const_iterator __thiscall
spvtools::opt::analysis::DefUseManager::UsersBegin(DefUseManager *this,Instruction *def)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  UserEntry local_30;
  
  local_30.user = (Instruction *)0x0;
  p_Var3 = (this->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    local_30.def = def;
    do {
      bVar1 = UserEntryLess::operator()
                        ((UserEntryLess *)&this->id_to_users_,(UserEntry *)(p_Var3 + 1),&local_30);
      if (!bVar1) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  return (const_iterator)p_Var2;
}

Assistant:

DefUseManager::IdToUsersMap::const_iterator DefUseManager::UsersBegin(
    const Instruction* def) const {
  return id_to_users_.lower_bound(
      UserEntry{const_cast<Instruction*>(def), nullptr});
}